

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalNinjaGenerator::CheckNinjaFeatures(cmGlobalNinjaGenerator *this)

{
  string *lhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  unsigned_long dyndep;
  string local_40;
  
  lhs = &this->NinjaVersion;
  paVar1 = &local_40.field_2;
  local_40.field_2._M_allocated_capacity._0_4_ = 0x352e31;
  local_40._M_string_length = 3;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,lhs,&local_40);
  this->NinjaSupportsConsolePool = !bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT17(local_40.field_2._M_local_buf[7],
                             CONCAT16(local_40.field_2._M_local_buf[6],
                                      CONCAT15(local_40.field_2._M_local_buf[5],
                                               CONCAT14(local_40.field_2._M_local_buf[4],
                                                        local_40.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x372e31;
  local_40._M_string_length = 3;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,lhs,&local_40);
  this->NinjaSupportsImplicitOuts = !bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT17(local_40.field_2._M_local_buf[7],
                             CONCAT16(local_40.field_2._M_local_buf[6],
                                      CONCAT15(local_40.field_2._M_local_buf[5],
                                               CONCAT14(local_40.field_2._M_local_buf[4],
                                                        local_40.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x382e31;
  local_40._M_string_length = 3;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,lhs,&local_40);
  this->NinjaSupportsManifestRestat = !bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT17(local_40.field_2._M_local_buf[7],
                             CONCAT16(local_40.field_2._M_local_buf[6],
                                      CONCAT15(local_40.field_2._M_local_buf[5],
                                               CONCAT14(local_40.field_2._M_local_buf[4],
                                                        local_40.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x392e31;
  local_40._M_string_length = 3;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,lhs,&local_40);
  this->NinjaSupportsMultilineDepfile = !bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT17(local_40.field_2._M_local_buf[7],
                             CONCAT16(local_40.field_2._M_local_buf[6],
                                      CONCAT15(local_40.field_2._M_local_buf[5],
                                               CONCAT14(local_40.field_2._M_local_buf[4],
                                                        local_40.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x30312e31;
  local_40._M_string_length = 4;
  local_40.field_2._M_local_buf[4] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,lhs,&local_40);
  this->NinjaSupportsDyndeps = !bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT17(local_40.field_2._M_local_buf[7],
                             CONCAT16(local_40.field_2._M_local_buf[6],
                                      CONCAT15(local_40.field_2._M_local_buf[5],
                                               CONCAT14(local_40.field_2._M_local_buf[4],
                                                        local_40.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if (this->NinjaSupportsDyndeps == false) {
    if (CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_);
      if (iVar3 != 0) {
        CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_._M_dataplus._M_p =
             (pointer)&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,".dyndep-","");
        __cxa_atexit(std::__cxx11::string::~string,&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_);
      }
    }
    lVar4 = std::__cxx11::string::find
                      ((char *)lhs,
                       (ulong)CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_._M_dataplus._M_p,0);
    if (lVar4 != -1) {
      local_40._M_dataplus._M_p = (pointer)0x0;
      cmStrToULong((lhs->_M_dataplus)._M_p +
                   CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_._M_string_length + lVar4,
                   (unsigned_long *)&local_40);
      if (local_40._M_dataplus._M_p == &DAT_00000001) {
        this->NinjaSupportsDyndeps = true;
      }
    }
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x30312e31;
  local_40._M_string_length = 4;
  local_40.field_2._M_local_buf[4] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,lhs,&local_40);
  this->NinjaSupportsUnconditionalRecompactTool = !bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT17(local_40.field_2._M_local_buf[7],
                             CONCAT16(local_40.field_2._M_local_buf[6],
                                      CONCAT15(local_40.field_2._M_local_buf[5],
                                               CONCAT14(local_40.field_2._M_local_buf[4],
                                                        local_40.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x30312e31;
  local_40._M_string_length = 4;
  local_40.field_2._M_local_buf[4] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,lhs,&local_40);
  this->NinjaSupportsRestatTool = !bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT17(local_40.field_2._M_local_buf[7],
                             CONCAT16(local_40.field_2._M_local_buf[6],
                                      CONCAT15(local_40.field_2._M_local_buf[5],
                                               CONCAT14(local_40.field_2._M_local_buf[4],
                                                        local_40.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x30312e31;
  local_40._M_string_length = 4;
  local_40.field_2._M_local_buf[4] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,lhs,&local_40);
  this->NinjaSupportsMultipleOutputs = !bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT17(local_40.field_2._M_local_buf[7],
                             CONCAT16(local_40.field_2._M_local_buf[6],
                                      CONCAT15(local_40.field_2._M_local_buf[5],
                                               CONCAT14(local_40.field_2._M_local_buf[4],
                                                        local_40.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x30312e31;
  local_40.field_2._M_local_buf[4] = '.';
  local_40.field_2._M_local_buf[5] = '2';
  local_40._M_string_length = 6;
  local_40.field_2._M_local_buf[6] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,lhs,&local_40);
  this->NinjaSupportsMetadataOnRegeneration = !bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT17(local_40.field_2._M_local_buf[7],
                             CONCAT16(local_40.field_2._M_local_buf[6],
                                      CONCAT15(local_40.field_2._M_local_buf[5],
                                               CONCAT14(local_40.field_2._M_local_buf[4],
                                                        local_40.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CheckNinjaFeatures()
{
  this->NinjaSupportsConsolePool =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForConsolePool());
  this->NinjaSupportsImplicitOuts = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion,
    cmGlobalNinjaGenerator::RequiredNinjaVersionForImplicitOuts());
  this->NinjaSupportsManifestRestat =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForManifestRestat());
  this->NinjaSupportsMultilineDepfile =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForMultilineDepfile());
  this->NinjaSupportsDyndeps =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForDyndeps());
  if (!this->NinjaSupportsDyndeps) {
    // The ninja version number is not new enough to have upstream support.
    // Our ninja branch adds ".dyndep-#" to its version number,
    // where '#' is a feature-specific version number.  Extract it.
    static std::string const k_DYNDEP_ = ".dyndep-";
    std::string::size_type pos = this->NinjaVersion.find(k_DYNDEP_);
    if (pos != std::string::npos) {
      const char* fv = &this->NinjaVersion[pos + k_DYNDEP_.size()];
      unsigned long dyndep = 0;
      cmStrToULong(fv, &dyndep);
      if (dyndep == 1) {
        this->NinjaSupportsDyndeps = true;
      }
    }
  }
  this->NinjaSupportsUnconditionalRecompactTool =
    !cmSystemTools::VersionCompare(
      cmSystemTools::OP_LESS, this->NinjaVersion,
      RequiredNinjaVersionForUnconditionalRecompactTool());
  this->NinjaSupportsRestatTool =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForRestatTool());
  this->NinjaSupportsMultipleOutputs =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForMultipleOutputs());
  this->NinjaSupportsMetadataOnRegeneration = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion,
    RequiredNinjaVersionForMetadataOnRegeneration());
#ifdef _WIN32
  this->NinjaSupportsCodePage =
    !cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                   RequiredNinjaVersionForCodePage());
  if (this->NinjaSupportsCodePage) {
    this->CheckNinjaCodePage();
  } else {
    this->NinjaExpectedEncoding = codecvt::ANSI;
  }
#endif
}